

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void build_output_uttfile(char *buf,char *dir,char *uttid,char *ctlspec)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  cmd_ln_t *cmdln;
  long lVar4;
  char *dir_00;
  char *dirname;
  int32 k;
  char *ctlspec_local;
  char *uttid_local;
  char *dir_local;
  char *buf_local;
  
  sVar3 = strlen(dir);
  iVar1 = (int)sVar3;
  if ((iVar1 < 5) || (iVar2 = strcmp(dir + (long)iVar1 + -4,",CTL"), iVar2 != 0)) {
    strcpy(buf,dir);
    buf[iVar1] = '/';
    strcpy(buf + (long)iVar1 + 1,uttid);
  }
  else if (*ctlspec == '/') {
    strcpy(buf,ctlspec);
  }
  else {
    strcpy(buf,dir);
    buf[iVar1 + -4] = '/';
    strcpy(buf + (long)iVar1 + -3,ctlspec);
  }
  cmdln = cmd_ln_get();
  lVar4 = cmd_ln_int_r(cmdln,"-build_outdirs");
  if (lVar4 != 0) {
    dir_00 = __ckd_salloc__(buf,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                            ,0x12f);
    path2dirname(buf,dir_00);
    build_directory(dir_00);
    ckd_free(dir_00);
  }
  return;
}

Assistant:

static void
build_output_uttfile(char *buf, char *dir, char *uttid, char *ctlspec)
{
    int32 k;

    k = strlen(dir);
    if ((k > 4) && (strcmp(dir + k - 4, ",CTL") == 0)) {        /* HACK!! Hardwired ,CTL */
        if (ctlspec[0] != '/') {
            strcpy(buf, dir);
            buf[k - 4] = '/';
            strcpy(buf + k - 3, ctlspec);
        }
        else
            strcpy(buf, ctlspec);
    }
    else {
        strcpy(buf, dir);
        buf[k] = '/';
        strcpy(buf + k + 1, uttid);
    }
    /* Build output directory structure if possible/requested (it is
     * by default). */
    if (cmd_ln_boolean("-build_outdirs")) {
        char *dirname = ckd_salloc(buf);
        path2dirname(buf, dirname);
        build_directory(dirname);
        ckd_free(dirname);
    }
}